

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O1

uint RDL_getSSSR(RDL_data *data,RDL_cycle ***ptr)

{
  uint uVar1;
  RDL_graph *pRVar2;
  char *pcVar3;
  RDL_URFinfo **ppRVar4;
  RDL_URFinfo *pRVar5;
  long *plVar6;
  uint *puVar7;
  long lVar8;
  uchar uVar9;
  uint size;
  int iVar10;
  uint nof_rows;
  uchar **rows;
  uchar **rows_00;
  uchar *empty_cycle;
  uchar *bitset;
  undefined8 *puVar11;
  void *pvVar12;
  RDL_cycle **ppRVar13;
  int iVar14;
  RDL_BCCGraph *pRVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint pos;
  uchar **compressed;
  ulong uVar20;
  uint local_a4;
  int local_94;
  void *local_90;
  int local_78;
  int local_74;
  ulong local_60;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    ppRVar13 = (RDL_cycle **)malloc(8);
    local_a4 = 0xffffffff;
  }
  else if (data->nofURFs == 0) {
    ppRVar13 = (RDL_cycle **)malloc(8);
    local_a4 = 0;
  }
  else {
    pRVar2 = data->graph;
    local_60 = 0x40;
    if (pRVar2->V <= pRVar2->E) {
      local_60 = (ulong)((pRVar2->E - pRVar2->V) + 1);
    }
    local_90 = malloc(local_60 * 8);
    pRVar15 = data->bccGraphs;
    if (pRVar15->nof_bcc == 0) {
      local_a4 = 0;
    }
    else {
      uVar16 = 0;
      size = 0;
      local_78 = 0;
      local_94 = 0;
      local_a4 = 0;
      do {
        pRVar2 = pRVar15->bcc_graphs[uVar16];
        iVar14 = pRVar2->E - pRVar2->V;
        rows = (uchar **)malloc((ulong)(iVar14 + 1) << 3);
        uVar1 = data->nofURFsPerBCC[uVar16];
        rows_00 = (uchar **)malloc((ulong)uVar1 * 8);
        if ((ulong)uVar1 != 0) {
          uVar18 = 0;
          compressed = rows_00;
          do {
            size = RDL_bitset_compressed
                             (compressed,(*data->urfInfoPerBCC[uVar16]->URFs[uVar18])->prototype,
                              pRVar2->E);
            uVar18 = uVar18 + 1;
            compressed = compressed + 1;
          } while (uVar18 < data->nofURFsPerBCC[uVar16]);
        }
        uVar18 = (ulong)size;
        empty_cycle = (uchar *)malloc(uVar18);
        memset(empty_cycle,0,uVar18);
        if (data->nofURFsPerBCC[uVar16] == 0) {
          uVar1 = 0;
        }
        else {
          uVar19 = 0;
          uVar1 = 0;
          local_74 = 0;
          do {
            bitset = (uchar *)malloc(uVar18);
            memcpy(bitset,rows_00[uVar19],uVar18);
            if (uVar1 != 0) {
              uVar20 = 0;
              do {
                uVar9 = RDL_bitset_test(bitset,(uint)uVar20);
                if (uVar9 != '\0') {
                  RDL_bitset_xor_inplace(bitset,rows[uVar20],size);
                }
                uVar20 = uVar20 + 1;
              } while (uVar1 != uVar20);
            }
            iVar10 = RDL_bitset_empty(bitset,empty_cycle,size);
            if (iVar10 == 0) {
              rows[uVar1] = bitset;
              nof_rows = uVar1 + 1;
              uVar9 = RDL_bitset_test(bitset,uVar1);
              if ((uVar9 == '\0') && (pos = nof_rows, nof_rows < pRVar2->E)) {
                do {
                  uVar9 = RDL_bitset_test(bitset,pos);
                  if (uVar9 != '\0') {
                    RDL_swap_columns(rows,nof_rows,uVar1,pos);
                    RDL_swap_columns(rows_00,data->nofURFsPerBCC[uVar16],uVar1,pos);
                    break;
                  }
                  pos = pos + 1;
                } while (pos < pRVar2->E);
              }
              pcVar3 = (*data->urfInfoPerBCC[uVar16]->URFs[uVar19])->prototype;
              if ((uint)local_60 <= local_a4) {
                local_60 = (ulong)((uint)local_60 * 2);
                local_90 = realloc(local_90,local_60 * 8);
              }
              puVar11 = (undefined8 *)malloc(0x18);
              *(undefined8 **)((long)local_90 + (ulong)local_a4 * 8) = puVar11;
              ppRVar4 = data->urfInfoPerBCC;
              pvVar12 = malloc((ulong)(*ppRVar4[uVar16]->URFs[uVar19])->weight << 3);
              *puVar11 = pvVar12;
              pRVar5 = ppRVar4[uVar16];
              plVar6 = *(long **)((long)local_90 + (ulong)local_a4 * 8);
              *(uint *)(plVar6 + 1) = (*pRVar5->URFs[uVar19])->weight;
              *(int *)((long)plVar6 + 0xc) = local_94;
              *(int *)(plVar6 + 2) = local_78;
              if (pRVar2->E != 0) {
                uVar20 = 0;
                uVar17 = 0;
                do {
                  if (pcVar3[uVar20] == '\x01') {
                    puVar7 = data->graph->edges
                             [data->bccGraphs->edge_from_bcc_mapping[uVar16][uVar20]];
                    lVar8 = *plVar6;
                    *(uint *)(lVar8 + uVar17 * 8) = *puVar7;
                    *(uint *)(lVar8 + 4 + uVar17 * 8) = puVar7[1];
                    uVar17 = (ulong)((int)uVar17 + 1);
                  }
                  uVar20 = uVar20 + 1;
                } while (uVar20 < pRVar2->E);
              }
              local_78 = local_78 + pRVar5->nofCFsPerURF[uVar19];
              local_a4 = local_a4 + 1;
              uVar1 = nof_rows;
              if (local_74 == iVar14) break;
              local_74 = local_74 + 1;
            }
            else {
              free(bitset);
            }
            uVar19 = uVar19 + 1;
            local_94 = local_94 + 1;
          } while (uVar19 < data->nofURFsPerBCC[uVar16]);
        }
        if (uVar1 != 0) {
          uVar18 = 0;
          do {
            free(rows[uVar18]);
            uVar18 = uVar18 + 1;
          } while (uVar1 != uVar18);
        }
        free(rows);
        if (data->nofURFsPerBCC[uVar16] != 0) {
          uVar18 = 0;
          do {
            free(rows_00[uVar18]);
            uVar18 = uVar18 + 1;
          } while (uVar18 < data->nofURFsPerBCC[uVar16]);
        }
        free(rows_00);
        free(empty_cycle);
        uVar16 = uVar16 + 1;
        pRVar15 = data->bccGraphs;
      } while (uVar16 < pRVar15->nof_bcc);
    }
    ppRVar13 = (RDL_cycle **)realloc(local_90,(ulong)local_a4 << 3);
  }
  *ptr = ppRVar13;
  return local_a4;
}

Assistant:

unsigned RDL_getSSSR(const RDL_data *data, RDL_cycle ***ptr)
{
  unsigned j, k, rcf=0, urf=0;
  RDL_cycle **result;
  unsigned size, added, currBond;
  unsigned bcc_index, internal_index;
  char* prototype;
  const RDL_graph* curr_graph;
  unsigned total_counter, alloced;
  unsigned edge;
  unsigned char *currentCycle;
  unsigned char **basisCycles;
  unsigned char **prototypesForGaussian;
  unsigned currentBasisCyclesSize;
  unsigned oldBasisCyclesSize;
  unsigned compressedSize = 0;
  const unsigned char* empty_cycle;


  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  if (data->nofURFs < 1) {
    (*ptr) = malloc(sizeof(**ptr));
    return 0;
  }

  total_counter = 0;
  if (data->graph->E < data->graph->V) {
    /*
     * if E - V + 1 < 1  <=> E - V < 0 <=> E < V
     *
     * graph is not connected and our heuristic for reservation
     * fails => allocate something ;)
     * */
    alloced = RDL_RESERVED_START;
  }
  else {
    alloced = data->graph->E - data->graph->V + 1;
  }
  result = malloc(alloced * sizeof(*result));

  /* calculate basis for each BCC (and therefore for each CC) */

  for (bcc_index = 0; bcc_index < data->bccGraphs->nof_bcc; ++bcc_index) {
    curr_graph = data->bccGraphs->bcc_graphs[bcc_index];

    size=curr_graph->E - curr_graph->V + 1;

    basisCycles = malloc(size * sizeof(*basisCycles));
    prototypesForGaussian =
        malloc(data->nofURFsPerBCC[bcc_index] * sizeof(*prototypesForGaussian));

    /* copy the prototypes for gaussian elimination */
    /*
     * it is sufficient to take the first prototype for each URF
     * (the other's are linearly dependent anyway
     */
    for (internal_index = 0;
        internal_index < data->nofURFsPerBCC[bcc_index]; ++internal_index) {
      compressedSize = RDL_bitset_compressed(&(prototypesForGaussian[internal_index]),
          data->urfInfoPerBCC[bcc_index]->URFs[internal_index][0]->prototype,
          curr_graph->E);
    }

    empty_cycle = malloc(compressedSize * sizeof(*empty_cycle));
    memset((unsigned char*)empty_cycle, 0, compressedSize * sizeof(*empty_cycle));

    added = 0;
    currentBasisCyclesSize = 0;

    for (internal_index = 0;
        internal_index < data->nofURFsPerBCC[bcc_index]; ++internal_index, ++urf) {

      currentCycle = malloc(compressedSize * sizeof(*currentCycle));
      memcpy(currentCycle, prototypesForGaussian[internal_index],
          compressedSize * sizeof(*currentCycle));

      /*
       * basisCycles is in row echelon form!result = realloc(result, nextfree * sizeof(*result));
       * [this corresponds to "add row operation"]
       */
      for (k = 0; k < currentBasisCyclesSize; ++k) {
        if (RDL_bitset_test(currentCycle, k)) {
          RDL_bitset_xor_inplace(currentCycle, basisCycles[k], compressedSize);
        }
      }

      if (RDL_bitset_empty(currentCycle, empty_cycle, compressedSize)) {
        free(currentCycle);
        continue;
      }
      /*
       * the current cycle is indepedent of equal and smaller
       * sized cycles => part of the basis
       */
      oldBasisCyclesSize = currentBasisCyclesSize;
      basisCycles[currentBasisCyclesSize] = currentCycle;
      ++currentBasisCyclesSize;

      /*
       * this is where the magic is happening: ensure that the basis is
       * indeed in row echelon form (we use the property throughout the algorithm)
       *
       * swap columns such that indeed the current ring with index currentBasisCycleSize-1
       * has a 1 at column currentBasisCycleSize-1
       * => ROW ECHELON FORM
       *
       * [this corresponds to the "swap columns operation" of gaussian elimination]
       */
      if (!RDL_bitset_test(currentCycle, oldBasisCyclesSize)) {
        for (k = oldBasisCyclesSize + 1; k < curr_graph->E; ++k) {
          if (RDL_bitset_test(currentCycle, k)) {
            RDL_swap_columns(basisCycles, currentBasisCyclesSize, oldBasisCyclesSize, k);
            RDL_swap_columns(prototypesForGaussian, data->nofURFsPerBCC[bcc_index], oldBasisCyclesSize, k);
            break;
          }
        }
      }

      prototype = data->urfInfoPerBCC[bcc_index]->URFs[internal_index][0]->prototype;

      /* can happen for unconnected graphs */
      if (total_counter >= alloced) {
        alloced *= 2;
        result = realloc(result, (alloced) * sizeof(*result));
      }

      currBond = 0;
      result[total_counter] = malloc(sizeof(**result));
      result[total_counter]->edges = malloc(data->urfInfoPerBCC[bcc_index]->URFs[internal_index][0]->weight *
                                   sizeof(*(result[total_counter]->edges)));
      result[total_counter]->weight = data->urfInfoPerBCC[bcc_index]->URFs[internal_index][0]->weight;
      result[total_counter]->urf = urf;
      result[total_counter]->rcf = rcf;
      for(j=0; j < curr_graph->E; ++j) {
        if(prototype[j] == 1) {
          edge = data->bccGraphs->edge_from_bcc_mapping[bcc_index][j];
          result[total_counter]->edges[currBond][0] = data->graph->edges[edge][0];
          result[total_counter]->edges[currBond][1] = data->graph->edges[edge][1];
          ++currBond;
        }
      }

      rcf += data->urfInfoPerBCC[bcc_index]->nofCFsPerURF[internal_index];

      /*if enough inRDL_dependent cycles were found, break out of the loop*/
      ++total_counter;
      if(++added == size) {
        break;
      }
    }

    for (k = 0; k < currentBasisCyclesSize; ++k) {
      free(basisCycles[k]);
    }
    free(basisCycles);

    for (k = 0; k < data->nofURFsPerBCC[bcc_index]; ++k) {
      free(prototypesForGaussian[k]);
    }
    free(prototypesForGaussian);
    free((void*)empty_cycle);
  }

  result = realloc(result, total_counter * sizeof(*result));

  (*ptr) = result;
  return total_counter;
}